

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcStatesStatesFixedScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,int *child1States,float *child1TransMat,
          int *child2States,float *child2TransMat,float *scaleFactors,int startPattern,
          int endPattern)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int local_64;
  
  iVar2 = this->kCategoryCount;
  if (0 < iVar2) {
    iVar3 = this->kPartialsPaddedStateCount;
    iVar4 = this->kPatternCount;
    iVar5 = this->kStateCount;
    iVar6 = this->kMatrixSize;
    iVar10 = 0;
    local_64 = 0;
    do {
      if (startPattern < endPattern) {
        iVar13 = (iVar4 * local_64 + startPattern) * iVar3;
        iVar7 = this->kTransPaddedStateCount;
        lVar11 = (long)startPattern;
        do {
          if (0 < iVar5) {
            fVar1 = scaleFactors[lVar11];
            iVar8 = child2States[lVar11];
            iVar9 = child1States[lVar11];
            lVar12 = 0;
            lVar14 = (long)iVar10;
            do {
              destP[iVar13 + lVar12] =
                   (child1TransMat[iVar9 + lVar14] * child2TransMat[iVar8 + lVar14]) / fVar1;
              lVar14 = lVar14 + iVar7;
              lVar12 = lVar12 + 1;
            } while (iVar5 != (int)lVar12);
            iVar13 = iVar13 + (int)lVar12;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != endPattern);
      }
      local_64 = local_64 + 1;
      iVar10 = iVar10 + iVar6;
    } while (local_64 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                     const int* child1States,
                                                                     const REALTYPE* child1TransMat,
                                                                     const int* child2States,
                                                                     const REALTYPE* child2TransMat,
                                                                     const REALTYPE* scaleFactors,
                                                                     int startPattern,
                                                                     int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
    int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = child1States[k];
            const int state2 = child2States[k];
            int w = l * kMatrixSize;
            REALTYPE scaleFactor = scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = child1TransMat[w + state1] *
                           child2TransMat[w + state2] / scaleFactor;
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}